

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
StringEqualNoCaseFailure::StringEqualNoCaseFailure
          (StringEqualNoCaseFailure *this,UtestShell *test,char *fileName,int lineNumber,
          char *expected,char *actual,SimpleString *text)

{
  char cVar1;
  char cVar2;
  int iVar3;
  SimpleString *in_RDI;
  long in_R8;
  TestFailure *in_R9;
  size_t failStart;
  DifferenceFormat in_stack_00000034;
  size_t in_stack_00000038;
  SimpleString *in_stack_00000040;
  TestFailure *in_stack_00000048;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  SimpleString *in_stack_ffffffffffffffa0;
  TestFailure *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  UtestShell *in_stack_ffffffffffffffc8;
  
  TestFailure::TestFailure
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  in_RDI->buffer_ = (char *)&PTR__StringEqualNoCaseFailure_0025dd50;
  TestFailure::createUserText(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  SimpleString::operator=
            (in_RDI,(SimpleString *)
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
                            ));
  SimpleString::~SimpleString((SimpleString *)0x2128b1);
  StringFromOrNull((char *)in_stack_ffffffffffffff88);
  StringFromOrNull((char *)in_stack_ffffffffffffff88);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SimpleString::operator+=
            (in_RDI,(SimpleString *)
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
                            ));
  SimpleString::~SimpleString((SimpleString *)0x21290d);
  SimpleString::~SimpleString((SimpleString *)0x212917);
  SimpleString::~SimpleString((SimpleString *)0x212921);
  if ((in_R8 != 0) && (in_R9 != (TestFailure *)0x0)) {
    do {
      cVar1 = SimpleString::ToLower('\0');
      iVar3 = (int)cVar1;
      cVar2 = SimpleString::ToLower('\0');
    } while (iVar3 == cVar2);
    SimpleString::SimpleString
              (in_RDI,(char *)CONCAT17(cVar1,CONCAT16(cVar2,CONCAT24(in_stack_ffffffffffffff7c,iVar3
                                                                    ))));
    TestFailure::createDifferenceAtPosString
              (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034);
    SimpleString::operator+=
              (in_RDI,(SimpleString *)
                      CONCAT17(cVar1,CONCAT16(cVar2,CONCAT24(in_stack_ffffffffffffff7c,iVar3))));
    SimpleString::~SimpleString((SimpleString *)0x212a71);
    SimpleString::~SimpleString((SimpleString *)0x212a7b);
  }
  return;
}

Assistant:

StringEqualNoCaseFailure::StringEqualNoCaseFailure(UtestShell* test, const char* fileName, int lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; SimpleString::ToLower(actual[failStart]) == SimpleString::ToLower(expected[failStart]); failStart++)
            ;
        message_ += createDifferenceAtPosString(actual, failStart);
    }
}